

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

Result wabt::ReadAll(FILE *stream,char *name,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  pointer puVar2;
  FILE *__stream;
  int iVar3;
  size_t __n;
  int *piVar4;
  char *pcVar5;
  uint8_t buffer [4096];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0);
  while( true ) {
    __n = fread(buffer,1,0x1000,(FILE *)stream);
    if (__n == 0) break;
    puVar1 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (out_data,(size_type)(puVar1 + (__n - (long)puVar2)));
    memcpy(puVar1 + ((long)(out_data->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start - (long)puVar2),buffer,__n);
  }
  iVar3 = ferror((FILE *)stream);
  __stream = _stderr;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"error reading from %s: %s\n",name,pcVar5);
  }
  return (Result)(uint)(iVar3 != 0);
}

Assistant:

static Result ReadAll(FILE* stream,
                      const char* name,
                      std::vector<uint8_t>* out_data) {
  out_data->resize(0);
  uint8_t buffer[4096];
  while (true) {
    size_t bytes_read = fread(buffer, 1, sizeof(buffer), stream);
    if (bytes_read == 0) {
      if (ferror(stream)) {
        fprintf(stderr, "error reading from %s: %s\n", name, strerror(errno));
        return Result::Error;
      }
      return Result::Ok;
    }
    size_t old_size = out_data->size();
    out_data->resize(old_size + bytes_read);
    memcpy(out_data->data() + old_size, buffer, bytes_read);
  }
}